

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_8x4_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  code *pcVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int8_t *piVar7;
  long lVar8;
  undefined7 in_register_00000009;
  __m128i *in;
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  __m128i buf0 [8];
  __m128i buf1 [8];
  undefined1 auVar11 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  piVar7 = av1_fwd_txfm_shift_ls[6];
  uVar4 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar2 = *(code **)((long)col_txfm8x4_arr + (ulong)(uVar4 * 8));
  pcVar3 = *(code **)((long)row_txfm4x8_arr + (ulong)(uVar4 * 8));
  bVar5 = false;
  if (uVar4 < 0x10) {
    if ((0x4110U >> (uVar4 & 0x1f) & 1) != 0) {
      bVar5 = false;
LAB_003f961e:
      load_buffer_16bit_to_16bit_flip(input,stride,buf0,4);
      goto LAB_003f9630;
    }
    if ((0x80a0U >> (uVar4 & 0x1f) & 1) == 0) {
      if (uVar4 == 6) {
        bVar5 = true;
        goto LAB_003f961e;
      }
    }
    else {
      bVar5 = true;
    }
  }
  load_buffer_16bit_to_16bit(input,stride,buf0,4);
LAB_003f9630:
  round_shift_16bit(buf0,4,(int)*piVar7);
  (*pcVar2)(buf0,buf0,0xd);
  round_shift_16bit(buf0,4,(int)piVar7[1]);
  transpose_16bit_8x8(buf0,buf1);
  in = buf1;
  if (bVar5) {
    flip_buf_sse2(buf1,buf0,8);
    in = buf0;
  }
  (*pcVar3)(in,in,0xd);
  round_shift_16bit(in,8,(int)piVar7[2]);
  auVar6 = _DAT_004c8090;
  for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 0x10) {
    auVar14 = *(undefined1 (*) [16])((long)*in + lVar8);
    auVar13._0_12_ = auVar14._0_12_;
    auVar13._12_2_ = auVar14._6_2_;
    auVar13._14_2_ = 1;
    auVar12._12_4_ = auVar13._12_4_;
    auVar12._0_10_ = auVar14._0_10_;
    auVar12._10_2_ = 1;
    auVar11._10_6_ = auVar12._10_6_;
    auVar11._0_8_ = auVar14._0_8_;
    auVar11._8_2_ = auVar14._4_2_;
    auVar10._8_8_ = auVar11._8_8_;
    auVar10._0_8_ = 0x1000000000000;
    auVar9._6_10_ = auVar10._6_10_;
    auVar9._4_2_ = auVar14._2_2_;
    auVar9._0_2_ = auVar14._0_2_;
    auVar9._2_2_ = 1;
    auVar14 = pmaddwd(auVar9,auVar6);
    piVar1 = (int *)((long)output + lVar8);
    *piVar1 = auVar14._0_4_ >> 0xc;
    piVar1[1] = auVar14._4_4_ >> 0xc;
    piVar1[2] = auVar14._8_4_ >> 0xc;
    piVar1[3] = auVar14._12_4_ >> 0xc;
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x4_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X4];
  const int txw_idx = get_txw_idx(TX_8X4);
  const int txh_idx = get_txh_idx(TX_8X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm8x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm4x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip)
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  else
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w4(buf, output, height, width);
}